

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O0

void * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::AddString(RepeatedPtrFieldBase *this)

{
  void *pvVar1;
  RepeatedPtrFieldBase *this_local;
  
  pvVar1 = AddInternal<google::protobuf::internal::RepeatedPtrFieldBase::AddString()::__0>(this);
  return pvVar1;
}

Assistant:

void* RepeatedPtrFieldBase::AddString() {
  return AddInternal([](Arena* arena) { return NewStringElement(arena); });
}